

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

Status * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivity(MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                   *this)

{
  __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  __first;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pCVar4;
  size_type sVar5;
  iterator this_00;
  reference pIVar6;
  EncoderBuffer *pEVar7;
  EncoderBuffer *data_size;
  long in_RSI;
  Status *in_RDI;
  long lVar8;
  MeshEdgebreakerTraversalPredictiveEncoder *this_01;
  reference rVar9;
  reference rVar10;
  reference rVar11;
  uint32_t num_encoded_symbols;
  CornerIndex ci;
  iterator __end3;
  iterator __begin3;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *__range3;
  FaceIndex opp_face_id;
  CornerIndex opp_id;
  VertexIndex prev_vert_id;
  VertexIndex next_vert_id;
  VertexIndex vert_id;
  bool interior_config;
  CornerIndex start_corner;
  FaceIndex face_id;
  CornerIndex corner_index;
  int c_id;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  init_face_connectivity_corners;
  int num_corners;
  uint8_t num_attribute_data;
  uint32_t num_faces;
  uint32_t num_vertices_to_be_encoded;
  undefined4 in_stack_fffffffffffffb28;
  Code in_stack_fffffffffffffb2c;
  MeshEdgebreakerTraversalEncoder *in_stack_fffffffffffffb30;
  __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  in_stack_fffffffffffffb38;
  __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  in_stack_fffffffffffffb40;
  size_type in_stack_fffffffffffffb48;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffb50;
  MeshEdgebreakerTraversalPredictiveEncoder *in_stack_fffffffffffffb58;
  FaceIndex in_stack_fffffffffffffb60;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 uVar13;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
  *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  in_stack_fffffffffffffb78;
  FaceIndex in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  const_iterator in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  Mesh *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  byte local_40a;
  CornerIndex in_stack_fffffffffffffc14;
  _Bit_type in_stack_fffffffffffffc18;
  _Bit_type *in_stack_fffffffffffffc20;
  _Bit_type in_stack_fffffffffffffc38;
  _Bit_type *in_stack_fffffffffffffc40;
  allocator<char> local_291;
  string local_290 [36];
  int local_26c;
  uint local_268;
  uint local_264;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_260;
  __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  local_258;
  long local_250;
  undefined1 local_241;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_240;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_238;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_230;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_228;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_218;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_210;
  allocator<char> local_201;
  string local_200 [36];
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  undefined4 local_1d0;
  allocator<char> local_1c9;
  string local_1c8 [36];
  uint local_1a4;
  reference local_1a0;
  uint local_18c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_188;
  uint local_184;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  reference local_170;
  undefined4 local_15c;
  reference local_158;
  reference local_148;
  reference local_138;
  uint local_128;
  uint local_124;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_120;
  uint local_11c;
  uint local_118;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_114;
  uint local_110;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_10c;
  uint local_108;
  byte local_101;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_100;
  uint local_fc;
  reference local_f8;
  uint local_e8;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_e4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_e0;
  uint local_dc;
  int local_c0;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [36];
  undefined4 local_6c;
  undefined1 local_65;
  undefined4 local_64;
  undefined1 local_5d;
  int local_5c;
  int local_58;
  allocator<char> local_41;
  string local_40 [64];
  
  if ((*(byte *)(in_RSI + 0x2b0) & 1) == 0) {
    CreateCornerTableFromPositionAttribute
              ((Mesh *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator=
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               in_stack_fffffffffffffb30,
               (unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               in_stack_fffffffffffffb40._M_current);
  }
  else {
    CreateCornerTableFromAllAttributes(in_stack_fffffffffffffba8);
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator=
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               in_stack_fffffffffffffb30,
               (unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
               in_stack_fffffffffffffb40._M_current);
  }
  bVar1 = std::operator==((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           *)in_stack_fffffffffffffb30,
                          (nullptr_t)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  if (!bVar1) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19a79d)
    ;
    iVar2 = CornerTable::num_faces((CornerTable *)0x19a7a5);
    pCVar4 = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
             operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                        0x19a7bd);
    iVar3 = CornerTable::NumDegeneratedFaces(pCVar4);
    if (iVar2 != iVar3) {
      MeshEdgebreakerTraversalPredictiveEncoder::Init
                (in_stack_fffffffffffffb58,
                 (MeshEdgebreakerEncoderImplInterface *)in_stack_fffffffffffffb50);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19a8b5);
      iVar2 = CornerTable::num_vertices((CornerTable *)0x19a8bd);
      pCVar4 = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
               operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           *)0x19a8d5);
      local_58 = CornerTable::NumIsolatedVertices(pCVar4);
      local_58 = iVar2 - local_58;
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
      EncodeVarint<unsigned_int>
                ((uint)in_stack_fffffffffffffb30,
                 (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19a92e);
      iVar2 = CornerTable::num_faces((CornerTable *)0x19a936);
      pCVar4 = std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
               operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                           *)0x19a94e);
      local_5c = CornerTable::NumDegeneratedFaces(pCVar4);
      local_5c = iVar2 - local_5c;
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
      EncodeVarint<unsigned_int>
                ((uint)in_stack_fffffffffffffb30,
                 (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      Mesh::num_faces((Mesh *)0x19a9b6);
      local_5d = 0;
      std::vector<bool,_std::allocator<bool>_>::assign
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb30,
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),(bool *)0x19a9d7);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19a9fb);
      CornerTable::num_vertices((CornerTable *)0x19aa03);
      local_64 = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (value_type_conflict1 *)0x19aa26);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)0x19aa37);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19aa57);
      CornerTable::num_faces((CornerTable *)0x19aa5f);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::reserve((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_),
                (size_type)in_stack_fffffffffffffb58);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19aa94);
      CornerTable::num_vertices((CornerTable *)0x19aa9c);
      local_65 = 0;
      std::vector<bool,_std::allocator<bool>_>::assign
                ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb30,
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),(bool *)0x19aabc);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x19aad0);
      *(undefined4 *)(in_RSI + 0x188) = 0xffffffff;
      *(undefined4 *)(in_RSI + 0x18c) = 0;
      std::vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>::
      clear((vector<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_> *
            )0x19aaf8);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)0x19ab0c);
      std::vector<bool,_std::allocator<bool>_>::clear(in_stack_fffffffffffffb50);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19ab42);
      CornerTable::num_vertices((CornerTable *)0x19ab4a);
      local_6c = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                 (value_type_conflict1 *)0x19ab6d);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::clear((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)0x19ab81);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19aba3);
      CornerTable::num_faces((CornerTable *)0x19abab);
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::reserve((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_),
                (size_type)in_stack_fffffffffffffb58);
      *(undefined4 *)(in_RSI + 0x90) = 0;
      bVar1 = FindHoles((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                         *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (char *)in_stack_fffffffffffffb68,
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_));
        Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                       (string *)0x19ac27);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        return in_RDI;
      }
      bVar1 = InitAttributeData(in_stack_fffffffffffffb68);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (char *)in_stack_fffffffffffffb68,
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_));
        Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                       (string *)0x19acf3);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
        return in_RDI;
      }
      sVar5 = std::
              vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
              ::size((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                      *)(in_RSI + 400));
      local_ba = (byte)sVar5;
      PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
      EncoderBuffer::Encode<unsigned_char>
                ((EncoderBuffer *)in_stack_fffffffffffffb58,(uchar *)in_stack_fffffffffffffb50);
      MeshEdgebreakerTraversalEncoder::SetNumAttributeData
                ((MeshEdgebreakerTraversalEncoder *)(in_RSI + 0x1c0),(uint)local_ba);
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19adc9);
      local_c0 = CornerTable::num_corners((CornerTable *)0x19add1);
      MeshEdgebreakerTraversalEncoder::Start
                ((MeshEdgebreakerTraversalEncoder *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::
      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ::vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                *)0x19adf9);
      rVar11._M_mask = in_stack_fffffffffffffc38;
      rVar11._M_p = in_stack_fffffffffffffc40;
      rVar10._M_mask = in_stack_fffffffffffffc18;
      rVar10._M_p = in_stack_fffffffffffffc20;
      local_dc = 0;
      do {
        if (local_c0 <= (int)local_dc) {
          lVar8 = in_RSI + 0xa0;
          local_210 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      std::
                      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ::begin((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          local_218 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      std::
                      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ::end((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          std::
          reverse<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>>
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          this_01 = (MeshEdgebreakerTraversalPredictiveEncoder *)(in_RSI + 0xa0);
          local_228 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      std::
                      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ::end((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          __gnu_cxx::
          __normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>
          ::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*>
                    ((__normal_iterator<const_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                      *)in_stack_fffffffffffffb30,
                     (__normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          local_230 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      std::
                      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ::begin((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          local_238 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                      std::
                      vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ::end((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          __first._M_current._4_4_ = in_stack_fffffffffffffb84;
          __first._M_current._0_4_ = in_stack_fffffffffffffb80.value_;
          this_00 = std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    insert<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>,void>
                              ((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                               in_stack_fffffffffffffb88,__first,in_stack_fffffffffffffb78);
          local_240 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)this_00;
          bVar1 = std::
                  vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                  ::empty((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                           *)in_stack_fffffffffffffb40._M_current);
          if (!bVar1) {
            Mesh::num_faces((Mesh *)0x19b942);
            local_241 = 0;
            std::vector<bool,_std::allocator<bool>_>::assign
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb30,
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       (bool *)0x19b96a);
            local_250 = in_RSI + 0xa0;
            local_258._M_current =
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                 std::
                 vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ::begin((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            local_260 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                        std::
                        vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        ::end((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                                  *)in_stack_fffffffffffffb30,
                                 (__normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              if (!bVar1) break;
              pIVar6 = __gnu_cxx::
                       __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                       ::operator*(&local_258);
              local_268 = pIVar6->value_;
              local_264 = local_268;
              EncodeAttributeConnectivitiesOnFace
                        ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                          *)this_00._M_current,(CornerIndex)(uint)((ulong)lVar8 >> 0x20));
              __gnu_cxx::
              __normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
              ::operator++(&local_258);
            }
          }
          MeshEdgebreakerTraversalPredictiveEncoder::Done(this_01);
          iVar2 = MeshEdgebreakerTraversalPredictiveEncoder::NumEncodedSymbols
                            ((MeshEdgebreakerTraversalPredictiveEncoder *)(in_RSI + 0x1c0));
          local_26c = iVar2;
          PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
          EncodeVarint<unsigned_int>
                    ((uint)in_stack_fffffffffffffb30,
                     (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
          ;
          uVar13 = *(undefined4 *)(in_RSI + 0x18c);
          pEVar7 = PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
          EncodeVarint<unsigned_int>
                    ((uint)in_stack_fffffffffffffb30,
                     (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
          ;
          bVar1 = EncodeSplitData((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                                   *)CONCAT44(uVar13,in_stack_fffffffffffffb60.value_));
          uVar12 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb60.value_);
          if (bVar1) {
            pEVar7 = PointCloudEncoder::buffer(*(PointCloudEncoder **)(in_RSI + 8));
            data_size = MeshEdgebreakerTraversalEncoder::buffer
                                  ((MeshEdgebreakerTraversalEncoder *)(in_RSI + 0x1c0));
            in_stack_fffffffffffffb40._M_current =
                 (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                 EncoderBuffer::data((EncoderBuffer *)0x19bbce);
            MeshEdgebreakerTraversalEncoder::buffer
                      ((MeshEdgebreakerTraversalEncoder *)(in_RSI + 0x1c0));
            EncoderBuffer::size((EncoderBuffer *)0x19bbfa);
            EncoderBuffer::Encode
                      ((EncoderBuffer *)in_stack_fffffffffffffb58,pEVar7,(size_t)data_size);
            OkStatus();
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar2,in_stack_fffffffffffffb70),(char *)pEVar7,
                       (allocator<char> *)CONCAT44(uVar13,uVar12));
            Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                           (string *)0x19bb1c);
            std::__cxx11::string::~string(local_290);
            std::allocator<char>::~allocator(&local_291);
          }
LAB_0019bc31:
          local_1d0 = 1;
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::~vector((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     *)in_stack_fffffffffffffb40._M_current);
          return in_RDI;
        }
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_e0,local_dc);
        std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                  ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                   0x19ae3f);
        local_e8 = local_e0.value_;
        local_e4.value_ =
             (uint)CornerTable::Face((CornerTable *)
                                     CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                                     (uint)in_stack_fffffffffffffb30);
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_e4);
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        local_f8 = rVar9;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
        if (!bVar1) {
          std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                    ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                     0x19af29);
          local_fc = local_e4.value_;
          bVar1 = CornerTable::IsDegenerated
                            ((CornerTable *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb60);
          if (!bVar1) {
            IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_100);
            local_108 = local_e4.value_;
            local_101 = FindInitFaceConfiguration
                                  ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                                    *)in_stack_fffffffffffffb78._M_current,in_stack_fffffffffffffb80
                                   ,(CornerIndex *)
                                    CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            MeshEdgebreakerTraversalEncoder::EncodeStartFaceConfiguration
                      (in_stack_fffffffffffffb30,SUB41((uint)in_stack_fffffffffffffb2c >> 0x18,0));
            if ((local_101 & 1) == 0) {
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b6b4);
              local_1d8 = local_100.value_;
              local_1d4 = (uint)CornerTable::Next((CornerTable *)
                                                  in_stack_fffffffffffffb38._M_current,
                                                  (CornerIndex)
                                                  (uint)in_stack_fffffffffffffb40._M_current);
              EncodeHole((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                          *)rVar10._M_mask,(CornerIndex)rVar10._M_p._4_4_,
                         SUB41(in_stack_fffffffffffffc14.value_ >> 0x18,0));
              local_1dc = local_100.value_;
              bVar1 = EncodeConnectivityFromCorner
                                ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                                  *)rVar11._M_mask,(CornerIndex)rVar11._M_p._4_4_);
              if (!bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (char *)in_stack_fffffffffffffb68,
                           (allocator<char> *)
                           CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_));
                Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                               (string *)0x19b78c);
                std::__cxx11::string::~string(local_200);
                std::allocator<char>::~allocator(&local_201);
                goto LAB_0019bc31;
              }
            }
            else {
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_e0,&local_100)
              ;
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b00a);
              local_110 = local_e0.value_;
              local_10c.value_ =
                   (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffb38._M_current,
                                             (uint)in_stack_fffffffffffffb40._M_current);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b057);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b06c);
              local_11c = local_e0.value_;
              local_118 = (uint)CornerTable::Next((CornerTable *)
                                                  in_stack_fffffffffffffb38._M_current,
                                                  (CornerIndex)
                                                  (uint)in_stack_fffffffffffffb40._M_current);
              local_114.value_ =
                   (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffb38._M_current,
                                             (uint)in_stack_fffffffffffffb40._M_current);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b0e4);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b0f9);
              local_128 = local_e0.value_;
              local_124 = (uint)CornerTable::Previous
                                          ((CornerTable *)in_stack_fffffffffffffb38._M_current,
                                           (CornerIndex)(uint)in_stack_fffffffffffffb40._M_current);
              local_120.value_ =
                   (uint)CornerTable::Vertex((CornerTable *)in_stack_fffffffffffffb38._M_current,
                                             (uint)in_stack_fffffffffffffb40._M_current);
              IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_10c);
              rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
              local_138 = rVar10;
              std::_Bit_reference::operator=(&local_138,true);
              IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_114);
              rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
              local_148 = rVar10;
              std::_Bit_reference::operator=(&local_148,true);
              IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_120);
              rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
              local_158 = rVar11;
              std::_Bit_reference::operator=(&local_158,true);
              local_15c = 1;
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb30,
                         (value_type_conflict1 *)
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_e4);
              rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
              local_170 = rVar10;
              std::_Bit_reference::operator=(&local_170,true);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b3b0);
              local_178 = local_e0.value_;
              in_stack_fffffffffffffc14 =
                   CornerTable::Next((CornerTable *)in_stack_fffffffffffffb38._M_current,
                                     (uint)in_stack_fffffffffffffb40._M_current);
              local_174 = in_stack_fffffffffffffc14.value_;
              std::
              vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           *)in_stack_fffffffffffffb30,
                          (value_type *)
                          CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b414);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b429);
              local_184 = local_e0.value_;
              local_180 = (uint)CornerTable::Next((CornerTable *)
                                                  in_stack_fffffffffffffb38._M_current,
                                                  (CornerIndex)
                                                  (uint)in_stack_fffffffffffffb40._M_current);
              local_17c = (uint)CornerTable::Opposite
                                          ((CornerTable *)
                                           CONCAT44(in_stack_fffffffffffffb2c,
                                                    in_stack_fffffffffffffb28),
                                           (CornerIndex)(uint)in_stack_fffffffffffffb30);
              std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
              operator->((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *
                         )0x19b499);
              local_18c = local_17c;
              local_188.value_ =
                   (uint)CornerTable::Face((CornerTable *)
                                           CONCAT44(in_stack_fffffffffffffb2c,
                                                    in_stack_fffffffffffffb28),
                                           (uint)in_stack_fffffffffffffb30);
              bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator!=
                                (&local_188,
                                 (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                                 &kInvalidFaceIndex);
              local_40a = 0;
              if (bVar1) {
                IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_188);
                rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
                local_1a0 = rVar9;
                bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_1a0);
                local_40a = bVar1 ^ 0xff;
              }
              if ((local_40a & 1) != 0) {
                local_1a4 = local_17c;
                bVar1 = EncodeConnectivityFromCorner
                                  ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
                                    *)rVar11._M_mask,(CornerIndex)rVar11._M_p._4_4_);
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                             (char *)in_stack_fffffffffffffb68,
                             (allocator<char> *)
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_));
                  Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                                 (string *)0x19b627);
                  std::__cxx11::string::~string(local_1c8);
                  std::allocator<char>::~allocator(&local_1c9);
                  goto LAB_0019bc31;
                }
              }
            }
          }
        }
        local_dc = local_dc + 1;
      } while( true );
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             (char *)in_stack_fffffffffffffb68,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60.value_)
            );
  Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,(string *)0x19a823);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return in_RDI;
}

Assistant:

Status MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivity() {
  // To encode the mesh, we need face connectivity data stored in a corner
  // table. To compute the connectivity we must use indices associated with
  // POSITION attribute, because they define which edges can be connected
  // together, unless the option |use_single_connectivity_| is set in which case
  // we break the mesh along attribute seams and use the same connectivity for
  // all attributes.
  if (use_single_connectivity_) {
    corner_table_ = CreateCornerTableFromAllAttributes(mesh_);
  } else {
    corner_table_ = CreateCornerTableFromPositionAttribute(mesh_);
  }
  if (corner_table_ == nullptr ||
      corner_table_->num_faces() == corner_table_->NumDegeneratedFaces()) {
    // Failed to construct the corner table.
    // TODO(ostava): Add better error reporting.
    return Status(Status::DRACO_ERROR, "All triangles are degenerate.");
  }

  traversal_encoder_.Init(this);

  // Also encode the total number of vertices that is going to be encoded.
  // This can be different from the mesh_->num_points() + num_new_vertices,
  // because some of the vertices of the input mesh can be ignored (e.g.
  // vertices on degenerated faces or isolated vertices not attached to any
  // face).
  const uint32_t num_vertices_to_be_encoded =
      corner_table_->num_vertices() - corner_table_->NumIsolatedVertices();
  EncodeVarint(num_vertices_to_be_encoded, encoder_->buffer());

  const uint32_t num_faces =
      corner_table_->num_faces() - corner_table_->NumDegeneratedFaces();
  EncodeVarint(num_faces, encoder_->buffer());

  // Reset encoder data that may have been initialized in previous runs.
  visited_faces_.assign(mesh_->num_faces(), false);
  pos_encoding_data_.vertex_to_encoded_attribute_value_index_map.assign(
      corner_table_->num_vertices(), -1);
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.clear();
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.reserve(
      corner_table_->num_faces() * 3);
  visited_vertex_ids_.assign(corner_table_->num_vertices(), false);
  vertex_traversal_length_.clear();
  last_encoded_symbol_id_ = -1;
  num_split_symbols_ = 0;
  topology_split_event_data_.clear();
  face_to_split_symbol_map_.clear();
  visited_holes_.clear();
  vertex_hole_id_.assign(corner_table_->num_vertices(), -1);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(corner_table_->num_faces());
  pos_encoding_data_.num_values = 0;

  if (!FindHoles()) {
    return Status(Status::DRACO_ERROR, "Failed to process mesh holes.");
  }

  if (!InitAttributeData()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize attribute data.");
  }

  const uint8_t num_attribute_data =
      static_cast<uint8_t>(attribute_data_.size());
  encoder_->buffer()->Encode(num_attribute_data);
  traversal_encoder_.SetNumAttributeData(num_attribute_data);

  const int num_corners = corner_table_->num_corners();

  traversal_encoder_.Start();

  std::vector<CornerIndex> init_face_connectivity_corners;
  // Traverse the surface starting from each unvisited corner.
  for (int c_id = 0; c_id < num_corners; ++c_id) {
    CornerIndex corner_index(c_id);
    const FaceIndex face_id = corner_table_->Face(corner_index);
    if (visited_faces_[face_id.value()]) {
      continue;  // Face has been already processed.
    }
    if (corner_table_->IsDegenerated(face_id)) {
      continue;  // Ignore degenerated faces.
    }

    CornerIndex start_corner;
    const bool interior_config =
        FindInitFaceConfiguration(face_id, &start_corner);
    traversal_encoder_.EncodeStartFaceConfiguration(interior_config);

    if (interior_config) {
      // Select the correct vertex on the face as the root.
      corner_index = start_corner;
      const VertexIndex vert_id = corner_table_->Vertex(corner_index);
      // Mark all vertices of a given face as visited.
      const VertexIndex next_vert_id =
          corner_table_->Vertex(corner_table_->Next(corner_index));
      const VertexIndex prev_vert_id =
          corner_table_->Vertex(corner_table_->Previous(corner_index));

      visited_vertex_ids_[vert_id.value()] = true;
      visited_vertex_ids_[next_vert_id.value()] = true;
      visited_vertex_ids_[prev_vert_id.value()] = true;
      // New traversal started. Initiate it's length with the first vertex.
      vertex_traversal_length_.push_back(1);

      // Mark the face as visited.
      visited_faces_[face_id.value()] = true;
      // Start compressing from the opposite face of the "next" corner. This way
      // the first encoded corner corresponds to the tip corner of the regular
      // edgebreaker traversal (essentially the initial face can be then viewed
      // as a TOPOLOGY_C face).
      init_face_connectivity_corners.push_back(
          corner_table_->Next(corner_index));
      const CornerIndex opp_id =
          corner_table_->Opposite(corner_table_->Next(corner_index));
      const FaceIndex opp_face_id = corner_table_->Face(opp_id);
      if (opp_face_id != kInvalidFaceIndex &&
          !visited_faces_[opp_face_id.value()]) {
        if (!EncodeConnectivityFromCorner(opp_id)) {
          return Status(Status::DRACO_ERROR,
                        "Failed to encode mesh component.");
        }
      }
    } else {
      // Boundary configuration. We start on a boundary rather than on a face.
      // First encode the hole that's opposite to the start_corner.
      EncodeHole(corner_table_->Next(start_corner), true);
      // Start processing the face opposite to the boundary edge (the face
      // containing the start_corner).
      if (!EncodeConnectivityFromCorner(start_corner)) {
        return Status(Status::DRACO_ERROR, "Failed to encode mesh component.");
      }
    }
  }
  // Reverse the order of connectivity corners to match the order in which
  // they are going to be decoded.
  std::reverse(processed_connectivity_corners_.begin(),
               processed_connectivity_corners_.end());
  // Append the init face connectivity corners (which are processed in order by
  // the decoder after the regular corners.
  processed_connectivity_corners_.insert(processed_connectivity_corners_.end(),
                                         init_face_connectivity_corners.begin(),
                                         init_face_connectivity_corners.end());
  // Encode connectivity for all non-position attributes.
  if (!attribute_data_.empty()) {
    // Use the same order of corner that will be used by the decoder.
    visited_faces_.assign(mesh_->num_faces(), false);
    for (CornerIndex ci : processed_connectivity_corners_) {
      EncodeAttributeConnectivitiesOnFace(ci);
    }
  }
  traversal_encoder_.Done();

  // Encode the number of symbols.
  const uint32_t num_encoded_symbols =
      static_cast<uint32_t>(traversal_encoder_.NumEncodedSymbols());
  EncodeVarint(num_encoded_symbols, encoder_->buffer());

  // Encode the number of split symbols.
  EncodeVarint(num_split_symbols_, encoder_->buffer());

  // Append the traversal buffer.
  if (!EncodeSplitData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode split data.");
  }
  encoder_->buffer()->Encode(traversal_encoder_.buffer().data(),
                             traversal_encoder_.buffer().size());

  return OkStatus();
}